

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

bool duckdb::StringUtil::CIEquals(char *l1,idx_t l1_size,char *l2,idx_t l2_size)

{
  byte *pbVar1;
  byte *pbVar2;
  idx_t iVar3;
  bool bVar4;
  
  if (l1_size != l2_size) {
    return false;
  }
  iVar3 = 0;
  do {
    bVar4 = l1_size == iVar3;
    if (bVar4) {
      return bVar4;
    }
    pbVar1 = (byte *)(l1 + iVar3);
    pbVar2 = (byte *)(l2 + iVar3);
    iVar3 = iVar3 + 1;
  } while (ASCII_TO_LOWER_MAP[*pbVar1] == ASCII_TO_LOWER_MAP[*pbVar2]);
  return bVar4;
}

Assistant:

bool StringUtil::CIEquals(const char *l1, idx_t l1_size, const char *l2, idx_t l2_size) {
	if (l1_size != l2_size) {
		return false;
	}
	const auto charmap = ASCII_TO_LOWER_MAP;
	for (idx_t c = 0; c < l1_size; c++) {
		if (charmap[(uint8_t)l1[c]] != charmap[(uint8_t)l2[c]]) {
			return false;
		}
	}
	return true;
}